

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ListBoxFooter(void)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImGuiStyle *bb_00;
  ImGuiStyle *style;
  ImRect bb;
  ImGuiWindow *parent_window;
  float in_stack_ffffffffffffffdc;
  
  pIVar2 = GetCurrentWindow();
  pIVar2 = pIVar2->ParentWindow;
  IVar1 = (pIVar2->DC).LastItemRect.Min;
  bb_00 = GetStyle();
  EndChildFrame();
  SameLine((float)((ulong)bb_00 >> 0x20),SUB84(bb_00,0));
  (pIVar2->DC).CursorPos = IVar1;
  ItemSize((ImRect *)bb_00,in_stack_ffffffffffffffdc);
  EndGroup();
  return;
}

Assistant:

void ImGui::ListBoxFooter()
{
    ImGuiWindow* parent_window = GetCurrentWindow()->ParentWindow;
    const ImRect bb = parent_window->DC.LastItemRect;
    const ImGuiStyle& style = GetStyle();

    EndChildFrame();

    // Redeclare item size so that it includes the label (we have stored the full size in LastItemRect)
    // We call SameLine() to restore DC.CurrentLine* data
    SameLine();
    parent_window->DC.CursorPos = bb.Min;
    ItemSize(bb, style.FramePadding.y);
    EndGroup();
}